

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O1

char * el::base::utils::DateTime::parseFormat
                 (char *buf,size_t bufSz,char *format,tm *tInfo,size_t msec,
                 MillisecondsWidth *msWidth)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  int iVar11;
  byte *pbVar12;
  byte local_50 [7];
  byte abStack_49 [9];
  ulong local_40;
  MillisecondsWidth *local_38;
  
  local_38 = msWidth;
  local_40 = msec;
  pbVar10 = (byte *)(buf + bufSz);
  do {
    if (*format == 0x25) {
      pbVar12 = (byte *)format + 1;
      bVar1 = ((byte *)format)[1];
      if (bVar1 < 0x61) {
        if (bVar1 < 0x41) {
          if ((bVar1 == 0) || (format = (char *)pbVar12, bVar1 == 0x25)) goto LAB_001164e5;
        }
        else {
          switch(bVar1) {
          case 0x41:
            if (buf < pbVar10) {
              pbVar9 = _ZN2el4base6constsL5kDaysE_rel +
                       *(int *)(_ZN2el4base6constsL5kDaysE_rel + (long)tInfo->tm_wday * 4);
              do {
                bVar1 = *pbVar9;
                *buf = bVar1;
                if (bVar1 == 0) break;
                pbVar9 = pbVar9 + 1;
                buf = (char *)((byte *)buf + 1);
              } while ((byte *)buf != pbVar10);
            }
            break;
          case 0x42:
            if (buf < pbVar10) {
              pbVar9 = _ZN2el4base6constsL7kMonthsE_rel +
                       *(int *)(_ZN2el4base6constsL7kMonthsE_rel + (long)tInfo->tm_mon * 4);
              do {
                bVar1 = *pbVar9;
                *buf = bVar1;
                if (bVar1 == 0) break;
                pbVar9 = pbVar9 + 1;
                buf = (char *)((byte *)buf + 1);
              } while ((byte *)buf != pbVar10);
            }
            break;
          case 0x43:
          case 0x44:
          case 0x45:
          case 0x47:
            break;
          case 0x46:
            if (buf < pbVar10) {
              pcVar6 = "AM";
              if (0xb < tInfo->tm_hour) {
                pcVar6 = "PM";
              }
              do {
                bVar1 = *pcVar6;
                *buf = bVar1;
                if (bVar1 == 0) break;
                pcVar6 = (char *)((byte *)pcVar6 + 1);
                buf = (char *)((byte *)buf + 1);
              } while ((byte *)buf != pbVar10);
            }
            break;
          case 0x48:
            abStack_49[1] = 0;
            abStack_49[2] = 0;
            if ((long)tInfo->tm_hour == 0) {
              uVar3 = 1;
              pbVar9 = abStack_49;
            }
            else {
              uVar7 = (long)tInfo->tm_hour;
              pbVar8 = abStack_49;
              uVar5 = 2;
              do {
                pbVar9 = pbVar8;
                *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                uVar3 = uVar5 - 1;
                if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
                bVar2 = 1 < uVar5;
                uVar7 = uVar7 / 10;
                pbVar8 = pbVar9 + -1;
                uVar5 = uVar3;
              } while (bVar2);
            }
            for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
              pbVar9[-1] = 0x30;
              pbVar9 = pbVar9 + -1;
            }
            if (buf < pbVar10) {
              do {
                bVar1 = *pbVar9;
                *buf = bVar1;
                if (bVar1 == 0) break;
                pbVar9 = pbVar9 + 1;
                buf = (char *)((byte *)buf + 1);
              } while ((byte *)buf != pbVar10);
            }
            break;
          default:
            if (bVar1 == 0x4d) {
              abStack_49[1] = 0;
              abStack_49[2] = 0;
              iVar4 = tInfo->tm_mon + 1;
              if (iVar4 == 0) {
                uVar5 = 1;
                pbVar8 = abStack_49;
              }
              else {
                uVar7 = (long)iVar4;
                pbVar9 = abStack_49;
                uVar3 = 2;
                do {
                  pbVar8 = pbVar9;
                  *pbVar8 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                  uVar5 = uVar3 - 1;
                  if ((uVar7 < 10) || (pbVar8 <= local_50)) break;
                  bVar2 = 1 < uVar3;
                  uVar7 = uVar7 / 10;
                  pbVar9 = pbVar8 + -1;
                  uVar3 = uVar5;
                } while (bVar2);
              }
              for (; (local_50 < pbVar8 && (0 < (int)uVar5)); uVar5 = uVar5 - 1) {
                pbVar8[-1] = 0x30;
                pbVar8 = pbVar8 + -1;
              }
              if (buf < pbVar10) {
                do {
                  bVar1 = *pbVar8;
                  *buf = bVar1;
                  if (bVar1 == 0) break;
                  pbVar8 = pbVar8 + 1;
                  buf = (char *)((byte *)buf + 1);
                } while ((byte *)buf != pbVar10);
              }
            }
            else if (bVar1 == 0x59) {
              uVar7 = (long)tInfo->tm_year + 0x76c;
              abStack_49[1] = 0;
              abStack_49[2] = 0;
              if ((int)uVar7 == 0) {
                uVar3 = 3;
                pbVar9 = abStack_49;
              }
              else {
                pbVar8 = abStack_49;
                uVar5 = 4;
                do {
                  pbVar9 = pbVar8;
                  *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                  uVar3 = uVar5 - 1;
                  if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
                  bVar2 = 1 < uVar5;
                  uVar7 = uVar7 / 10;
                  pbVar8 = pbVar9 + -1;
                  uVar5 = uVar3;
                } while (bVar2);
              }
              for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
                pbVar9[-1] = 0x30;
                pbVar9 = pbVar9 + -1;
              }
              if (buf < pbVar10) {
                do {
                  bVar1 = *pbVar9;
                  *buf = bVar1;
                  if (bVar1 == 0) break;
                  pbVar9 = pbVar9 + 1;
                  buf = (char *)((byte *)buf + 1);
                } while ((byte *)buf != pbVar10);
              }
            }
          }
        }
      }
      else if (bVar1 < 0x73) {
        switch(bVar1) {
        case 0x61:
          if (buf < pbVar10) {
            pbVar9 = _ZN2el4base6constsL11kDaysAbbrevE_rel +
                     *(int *)(_ZN2el4base6constsL11kDaysAbbrevE_rel + (long)tInfo->tm_wday * 4);
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
          break;
        case 0x62:
          if (buf < pbVar10) {
            pbVar9 = _ZN2el4base6constsL13kMonthsAbbrevE_rel +
                     *(int *)(_ZN2el4base6constsL13kMonthsAbbrevE_rel + (long)tInfo->tm_mon * 4);
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
          break;
        case 100:
          abStack_49[1] = 0;
          abStack_49[2] = 0;
          if ((long)tInfo->tm_mday == 0) {
            uVar3 = 1;
            pbVar9 = abStack_49;
          }
          else {
            uVar7 = (long)tInfo->tm_mday;
            pbVar8 = abStack_49;
            uVar5 = 2;
            do {
              pbVar9 = pbVar8;
              *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
              uVar3 = uVar5 - 1;
              if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
              bVar2 = 1 < uVar5;
              uVar7 = uVar7 / 10;
              pbVar8 = pbVar9 + -1;
              uVar5 = uVar3;
            } while (bVar2);
          }
          for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
            pbVar9[-1] = 0x30;
            pbVar9 = pbVar9 + -1;
          }
          if (buf < pbVar10) {
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
          break;
        case 0x67:
switchD_00116525_caseD_67:
          iVar4 = msWidth->m_width;
          abStack_49[1] = 0;
          abStack_49[2] = 0;
          if (msec == 0) {
            iVar11 = iVar4 + -1;
            pbVar9 = abStack_49;
          }
          else {
            uVar7 = local_40;
            pbVar8 = abStack_49;
            if (iVar4 < 1) {
              pbVar9 = abStack_49 + 1;
              iVar11 = iVar4;
            }
            else {
              do {
                pbVar9 = pbVar8;
                *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                iVar11 = iVar4 + -1;
                if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
                bVar2 = 1 < iVar4;
                uVar7 = uVar7 / 10;
                pbVar8 = pbVar9 + -1;
                iVar4 = iVar11;
              } while (bVar2);
            }
          }
          for (; (local_50 < pbVar9 && (0 < iVar11)); iVar11 = iVar11 + -1) {
            pbVar9[-1] = 0x30;
            pbVar9 = pbVar9 + -1;
          }
          if (buf < pbVar10) {
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
          break;
        case 0x68:
          iVar4 = tInfo->tm_hour;
          abStack_49[1] = 0;
          abStack_49[2] = 0;
          iVar4 = iVar4 + (((uint)(iVar4 / 6 + (iVar4 >> 0x1f)) >> 1) - (iVar4 >> 0x1f)) * -0xc;
          if (iVar4 == 0) {
            uVar3 = 1;
            pbVar9 = abStack_49;
          }
          else {
            uVar7 = (long)iVar4;
            pbVar8 = abStack_49;
            uVar5 = 2;
            do {
              pbVar9 = pbVar8;
              *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
              uVar3 = uVar5 - 1;
              if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
              bVar2 = 1 < uVar5;
              uVar7 = uVar7 / 10;
              pbVar8 = pbVar9 + -1;
              uVar5 = uVar3;
            } while (bVar2);
          }
          for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
            pbVar9[-1] = 0x30;
            pbVar9 = pbVar9 + -1;
          }
          if (buf < pbVar10) {
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
          break;
        case 0x6d:
          abStack_49[1] = 0;
          abStack_49[2] = 0;
          if ((long)tInfo->tm_min == 0) {
            uVar3 = 1;
            pbVar9 = abStack_49;
          }
          else {
            uVar7 = (long)tInfo->tm_min;
            pbVar8 = abStack_49;
            uVar5 = 2;
            do {
              pbVar9 = pbVar8;
              *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
              uVar3 = uVar5 - 1;
              if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
              bVar2 = 1 < uVar5;
              uVar7 = uVar7 / 10;
              pbVar8 = pbVar9 + -1;
              uVar5 = uVar3;
            } while (bVar2);
          }
          for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
            pbVar9[-1] = 0x30;
            pbVar9 = pbVar9 + -1;
          }
          if (buf < pbVar10) {
            do {
              bVar1 = *pbVar9;
              *buf = bVar1;
              if (bVar1 == 0) break;
              pbVar9 = pbVar9 + 1;
              buf = (char *)((byte *)buf + 1);
            } while ((byte *)buf != pbVar10);
          }
        }
      }
      else if (bVar1 == 0x73) {
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((long)tInfo->tm_sec == 0) {
          uVar3 = 1;
          pbVar9 = abStack_49;
        }
        else {
          uVar7 = (long)tInfo->tm_sec;
          pbVar8 = abStack_49;
          uVar5 = 2;
          do {
            pbVar9 = pbVar8;
            *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
            uVar3 = uVar5 - 1;
            if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
            bVar2 = 1 < uVar5;
            uVar7 = uVar7 / 10;
            pbVar8 = pbVar9 + -1;
            uVar5 = uVar3;
          } while (bVar2);
        }
        for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
          pbVar9[-1] = 0x30;
          pbVar9 = pbVar9 + -1;
        }
        if (buf < pbVar10) {
          do {
            bVar1 = *pbVar9;
            *buf = bVar1;
            if (bVar1 == 0) break;
            pbVar9 = pbVar9 + 1;
            buf = (char *)((byte *)buf + 1);
          } while ((byte *)buf != pbVar10);
        }
      }
      else if (bVar1 == 0x79) {
        uVar7 = (long)tInfo->tm_year + 0x76c;
        abStack_49[1] = 0;
        abStack_49[2] = 0;
        if ((int)uVar7 == 0) {
          uVar3 = 1;
          pbVar9 = abStack_49;
        }
        else {
          pbVar8 = abStack_49;
          uVar5 = 2;
          do {
            pbVar9 = pbVar8;
            *pbVar9 = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
            uVar3 = uVar5 - 1;
            if ((uVar7 < 10) || (pbVar9 <= local_50)) break;
            bVar2 = 1 < uVar5;
            uVar7 = uVar7 / 10;
            pbVar8 = pbVar9 + -1;
            uVar5 = uVar3;
          } while (bVar2);
        }
        for (; (local_50 < pbVar9 && (0 < (int)uVar3)); uVar3 = uVar3 - 1) {
          pbVar9[-1] = 0x30;
          pbVar9 = pbVar9 + -1;
        }
        if (buf < pbVar10) {
          do {
            bVar1 = *pbVar9;
            *buf = bVar1;
            if (bVar1 == 0) break;
            pbVar9 = pbVar9 + 1;
            buf = (char *)((byte *)buf + 1);
          } while ((byte *)buf != pbVar10);
        }
      }
      else if (bVar1 == 0x7a) goto switchD_00116525_caseD_67;
    }
    else {
      if (*format == 0) {
        return (char *)(byte *)buf;
      }
LAB_001164e5:
      if ((byte *)buf == pbVar10) {
        return (char *)(byte *)buf;
      }
      *buf = *format;
      buf = (char *)((byte *)buf + 1);
      pbVar12 = (byte *)format;
    }
    format = (char *)(pbVar12 + 1);
  } while( true );
}

Assistant:

static char* parseFormat(char* buf, std::size_t bufSz, const char* format, const struct tm* tInfo,
            std::size_t msec, const base::MillisecondsWidth* msWidth) {
        const char* bufLim = buf + bufSz;
        for (; *format; ++format) {
            if (*format == base::consts::kFormatSpecifierChar) {
                switch (*++format) {
                case base::consts::kFormatSpecifierChar:  // Escape
                    break;
                case '\0':  // End
                    --format;
                    break;
                case 'd':  // Day
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mday, 2, buf, bufLim);
                    continue;
                case 'a':  // Day of week (short)
                    buf = base::utils::Str::addToBuff(base::consts::kDaysAbbrev[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'A':  // Day of week (long)
                    buf = base::utils::Str::addToBuff(base::consts::kDays[tInfo->tm_wday], buf, bufLim);
                    continue;
                case 'M':  // month
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_mon + 1, 2, buf, bufLim);
                    continue;
                case 'b':  // month (short)
                    buf = base::utils::Str::addToBuff(base::consts::kMonthsAbbrev[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'B':  // month (long)
                    buf = base::utils::Str::addToBuff(base::consts::kMonths[tInfo->tm_mon], buf, bufLim);
                    continue;
                case 'y':  // year (two digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 2, buf, bufLim);
                    continue;
                case 'Y':  // year (four digits)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_year + base::consts::kYearBase, 4, buf, bufLim);
                    continue;
                case 'h':  // hour (12-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour % 12, 2, buf, bufLim);
                    continue;
                case 'H':  // hour (24-hour)
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_hour, 2, buf, bufLim);
                    continue;
                case 'm':  // minute
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_min, 2, buf, bufLim);
                    continue;
                case 's':  // second
                    buf = base::utils::Str::convertAndAddToBuff(tInfo->tm_sec, 2, buf, bufLim);
                    continue;
                case 'z':  // milliseconds
                case 'g':
                    buf = base::utils::Str::convertAndAddToBuff(msec, msWidth->m_width, buf, bufLim);
                    continue;
                case 'F':  // AM/PM
                    buf = base::utils::Str::addToBuff((tInfo->tm_hour >= 12) ? base::consts::kPm : base::consts::kAm, buf, bufLim);
                    continue;
                default:
                    continue;
                }
            }
            if (buf == bufLim) break;
            *buf++ = *format;
        }
        return buf;
    }